

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitivePacket.cpp
# Opt level: O0

void __thiscall
rr::GeometryEmitter::EmitVertex
          (GeometryEmitter *this,Vec4 *position,float pointSize,GenericVec4 *varyings,
          int primitiveID)

{
  ulong uVar1;
  size_t sVar2;
  ulong local_40;
  size_t ndx;
  VertexPacket *packet;
  GenericVec4 *pGStack_28;
  int primitiveID_local;
  GenericVec4 *varyings_local;
  Vec4 *pVStack_18;
  float pointSize_local;
  Vec4 *position_local;
  GeometryEmitter *this_local;
  
  uVar1 = this->m_numEmitted + 1;
  this->m_numEmitted = uVar1;
  if (uVar1 <= this->m_maxVertices) {
    packet._4_4_ = primitiveID;
    pGStack_28 = varyings;
    varyings_local._4_4_ = pointSize;
    pVStack_18 = position;
    position_local = (Vec4 *)this;
    ndx = (size_t)VertexPacketAllocator::alloc(this->m_vpalloc);
    *(undefined8 *)(((VertexPacket *)ndx)->position).m_data = *(undefined8 *)pVStack_18->m_data;
    *(undefined8 *)((((VertexPacket *)ndx)->position).m_data + 2) =
         *(undefined8 *)(pVStack_18->m_data + 2);
    ((VertexPacket *)ndx)->pointSize = varyings_local._4_4_;
    ((VertexPacket *)ndx)->primitiveID = packet._4_4_;
    for (local_40 = 0; sVar2 = VertexPacketAllocator::getNumVertexOutputs(this->m_vpalloc),
        local_40 < sVar2; local_40 = local_40 + 1) {
      GenericVec4::operator=((GenericVec4 *)(ndx + 0x20 + local_40 * 0x10),pGStack_28 + local_40);
    }
    std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::push_back
              (&this->m_emitted,(value_type *)&ndx);
  }
  return;
}

Assistant:

void GeometryEmitter::EmitVertex (const tcu::Vec4& position, float pointSize, const GenericVec4* varyings, int primitiveID)
{
	VertexPacket* packet;

	if (++m_numEmitted > m_maxVertices)
	{
		DE_FATAL("Undefined results, too many vertices emitted.");
		return;
	}

	packet = m_vpalloc.alloc();

	packet->position = position;
	packet->pointSize = pointSize;
	packet->primitiveID = primitiveID;

	for (size_t ndx = 0; ndx < m_vpalloc.getNumVertexOutputs(); ++ndx)
		packet->outputs[ndx] = varyings[ndx];

	m_emitted.push_back(packet);
}